

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::numbers_internal::safe_strto8_base
          (numbers_internal *this,string_view text,int8_t *value,int base)

{
  string_view text_00;
  bool bVar1;
  int base_local;
  int8_t *value_local;
  string_view text_local;
  
  text_00._M_str = (char *)text._M_len;
  text_00._M_len = (size_t)this;
  bVar1 = anon_unknown_0::safe_int_internal<signed_char>(text_00,text._M_str,(int)value);
  return bVar1;
}

Assistant:

bool safe_strto8_base(absl::string_view text, int8_t* absl_nonnull value,
                      int base) {
  return safe_int_internal<int8_t>(text, value, base);
}